

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

CURLUcode hostname_check(Curl_URL *u,char *hostname)

{
  char cVar1;
  CURLUcode CVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  char cVar6;
  ulong uVar7;
  char *pcVar8;
  char zoneid [16];
  char local_38 [16];
  
  sVar3 = strlen(hostname);
  pcVar8 = hostname + 1;
  if (*hostname != '[') {
    sVar4 = strcspn(hostname," ");
    if (sVar3 != sVar4) {
      return CURLUE_MALFORMED_INPUT;
    }
    goto LAB_001317d4;
  }
  sVar4 = strspn(pcVar8,"0123456789abcdefABCDEF::.");
  hostname = pcVar8;
  if (sVar3 - 2 == sVar4) goto LAB_001317d4;
  if (pcVar8[sVar4] != '%') {
    return CURLUE_MALFORMED_INPUT;
  }
  pcVar8 = pcVar8 + sVar4;
  pcVar5 = pcVar8 + 1;
  cVar6 = pcVar8[1];
  if (pcVar8[1] == '2') {
    cVar6 = '2';
    if (((pcVar8[2] == '5') && (cVar1 = pcVar8[3], cVar1 != '\0')) && (cVar1 != ']')) {
      pcVar5 = pcVar8 + 3;
      cVar6 = cVar1;
      goto LAB_00131792;
    }
  }
  else {
LAB_00131792:
    if (cVar6 == '\0') {
      return CURLUE_MALFORMED_INPUT;
    }
  }
  uVar7 = 0;
  while ((cVar6 != ']' && (uVar7 < 0xf))) {
    local_38[uVar7] = cVar6;
    cVar6 = pcVar5[uVar7 + 1];
    uVar7 = uVar7 + 1;
    if (cVar6 == '\0') {
      return CURLUE_MALFORMED_INPUT;
    }
  }
  if (uVar7 == 0) {
    return CURLUE_MALFORMED_INPUT;
  }
  if (cVar6 != ']') {
    return CURLUE_MALFORMED_INPUT;
  }
  local_38[uVar7] = '\0';
  pcVar5 = (*Curl_cstrdup)(local_38);
  u->zoneid = pcVar5;
  if (pcVar5 == (char *)0x0) {
    return CURLUE_OUT_OF_MEMORY;
  }
  pcVar8[0] = ']';
  pcVar8[1] = '\0';
LAB_001317d4:
  CVar2 = CURLUE_NO_HOST;
  if (*hostname != '\0') {
    CVar2 = CURLUE_OK;
  }
  return CVar2;
}

Assistant:

static CURLUcode hostname_check(struct Curl_URL *u, char *hostname)
{
  const char *l = NULL; /* accepted characters */
  size_t len;
  size_t hlen = strlen(hostname);

  if(hostname[0] == '[') {
    hostname++;
    l = "0123456789abcdefABCDEF::.";
    hlen -= 2;
  }

  if(l) {
    /* only valid letters are ok */
    len = strspn(hostname, l);
    if(hlen != len) {
      if(hostname[len] == '%') {
        /* this could now be '%[zone id]' */
        char zoneid[16];
        int i = 0;
        char *h = &hostname[len + 1];
        /* pass '25' if present and is a url encoded percent sign */
        if(!strncmp(h, "25", 2) && h[2] && (h[2] != ']'))
          h += 2;
        while(*h && (*h != ']') && (i < 15))
          zoneid[i++] = *h++;
        if(!i || (']' != *h))
          return CURLUE_MALFORMED_INPUT;
        zoneid[i] = 0;
        u->zoneid = strdup(zoneid);
        if(!u->zoneid)
          return CURLUE_OUT_OF_MEMORY;
        hostname[len] = ']'; /* insert end bracket */
        hostname[len + 1] = 0; /* terminate the hostname */
      }
      else
        return CURLUE_MALFORMED_INPUT;
      /* hostname is fine */
    }
  }
  else {
    /* letters from the second string is not ok */
    len = strcspn(hostname, " ");
    if(hlen != len)
      /* hostname with bad content */
      return CURLUE_MALFORMED_INPUT;
  }
  if(!hostname[0])
    return CURLUE_NO_HOST;
  return CURLUE_OK;
}